

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O0

bool tinyusdz::LoadUSDCFromFile
               (string *_filename,Stage *stage,string *warn,string *err,USDLoadOptions *options)

{
  bool bVar1;
  long lVar2;
  size_type sVar3;
  uchar *addr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  size_t local_160;
  size_t max_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  undefined1 local_120 [8];
  string _err_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8 [7];
  bool ret;
  int local_d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [32];
  undefined1 local_b0 [8];
  string _err;
  undefined1 local_90 [8];
  MMapFileHandle handle;
  string filepath;
  USDLoadOptions *options_local;
  string *err_local;
  string *warn_local;
  Stage *stage_local;
  string *_filename_local;
  
  io::ExpandFilePath((string *)&handle.size,(string *)_filename,(void *)0x0);
  bVar1 = io::IsMMapSupported();
  if (bVar1) {
    io::MMapFileHandle::MMapFileHandle((MMapFileHandle *)local_90);
    ::std::__cxx11::string::string((string *)local_b0);
    bVar1 = io::MMapFile((string *)&handle.size,(MMapFileHandle *)local_90,false,(string *)local_b0)
    ;
    if (bVar1) {
      lVar2 = ::std::__cxx11::string::size();
      if ((lVar2 != 0) && (warn != (string *)0x0)) {
        ::std::operator+(local_f8,local_b0);
        ::std::__cxx11::string::operator+=((string *)warn,(string *)local_f8);
        ::std::__cxx11::string::~string((string *)local_f8);
      }
      local_d4 = 0;
    }
    else {
      if (err != (string *)0x0) {
        ::std::operator+(local_d0,local_b0);
        ::std::__cxx11::string::operator+=((string *)err,(string *)local_d0);
        ::std::__cxx11::string::~string((string *)local_d0);
      }
      _filename_local._7_1_ = 0;
      local_d4 = 1;
    }
    ::std::__cxx11::string::~string((string *)local_b0);
    if (local_d4 == 0) {
      _filename_local._7_1_ =
           LoadUSDCFromMemory((uint8_t *)handle._32_8_,(size_t)handle.addr,(string *)&handle.size,
                              stage,warn,err,options);
      ::std::__cxx11::string::string((string *)local_120);
      io::UnmapFile((MMapFileHandle *)local_90,(string *)local_120);
      lVar2 = ::std::__cxx11::string::size();
      if ((lVar2 != 0) && (warn != (string *)0x0)) {
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,local_120);
        ::std::__cxx11::string::operator+=
                  ((string *)warn,
                   (string *)
                   &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        ::std::__cxx11::string::~string
                  ((string *)
                   &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
      ::std::__cxx11::string::~string((string *)local_120);
      local_d4 = 1;
    }
    io::MMapFileHandle::~MMapFileHandle((MMapFileHandle *)local_90);
  }
  else {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&max_bytes);
    local_160 = (long)options->max_memory_limit_in_mb << 0x14;
    bVar1 = io::ReadWholeFile((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&max_bytes,
                              (string *)err,(string *)&handle.size,local_160,(void *)0x0);
    if (bVar1) {
      sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&max_bytes);
      if (sVar3 < 0x58) {
        if (err != (string *)0x0) {
          ::std::operator+((char *)&local_1e0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "File size too short. Looks like this file is not a USDC : \"");
          ::std::operator+(&local_1c0,&local_1e0,"\"\n");
          ::std::__cxx11::string::operator+=((string *)err,(string *)&local_1c0);
          ::std::__cxx11::string::~string((string *)&local_1c0);
          ::std::__cxx11::string::~string((string *)&local_1e0);
        }
        _filename_local._7_1_ = false;
      }
      else {
        addr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&max_bytes);
        sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&max_bytes);
        _filename_local._7_1_ =
             LoadUSDCFromMemory(addr,sVar3,(string *)&handle.size,stage,warn,err,options);
      }
    }
    else {
      if (err != (string *)0x0) {
        ::std::operator+((char *)&local_1a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "File not found or failed to read : \"");
        ::std::operator+(&local_180,&local_1a0,"\"\n");
        ::std::__cxx11::string::operator+=((string *)err,(string *)&local_180);
        ::std::__cxx11::string::~string((string *)&local_180);
        ::std::__cxx11::string::~string((string *)&local_1a0);
      }
      _filename_local._7_1_ = false;
    }
    local_d4 = 1;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&max_bytes);
  }
  ::std::__cxx11::string::~string((string *)&handle.size);
  return (bool)(_filename_local._7_1_ & 1);
}

Assistant:

bool LoadUSDCFromFile(const std::string &_filename, Stage *stage,
                      std::string *warn, std::string *err,
                      const USDLoadOptions &options) {
  std::string filepath = io::ExpandFilePath(_filename, /* userdata */ nullptr);

  if (io::IsMMapSupported()) {
    io::MMapFileHandle handle;
    
    {
      std::string _err;
      if (!io::MMapFile(filepath, &handle, /* writable */false, &_err)) {
        if (err) {
          (*err) += _err + "\n";
        }
        return false; 
      }

      if (_err.size()) {
        if (warn) {
          (*warn) += _err + "\n";
        }
      }
    }

    bool ret = LoadUSDCFromMemory(handle.addr, size_t(handle.size), filepath, stage, warn,
                              err, options);

    {
      std::string _err;
      // Ignore unmap result for now.
      io::UnmapFile(handle, &_err);

      if (_err.size()) {
        if (warn) {
          (*warn) += _err + "\n";
        }
      }
    }

    return ret;

  } else {
    std::vector<uint8_t> data;
    size_t max_bytes = 1024 * 1024 * size_t(options.max_memory_limit_in_mb);
    if (!io::ReadWholeFile(&data, err, filepath, max_bytes,
                           /* userdata */ nullptr)) {
      if (err) {
        (*err) += "File not found or failed to read : \"" + filepath + "\"\n";
      }

      return false;
    }

    DCOUT("File size: " + std::to_string(data.size()) + " bytes.");

    if (data.size() < (11 * 8)) {
      // ???
      if (err) {
        (*err) += "File size too short. Looks like this file is not a USDC : \"" +
                  filepath + "\"\n";
      }
      return false;
    }

    return LoadUSDCFromMemory(data.data(), data.size(), filepath, stage, warn,
                              err, options);
  }
}